

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSpatialAlgebra.h
# Opt level: O0

void __thiscall
btSpatialTransformationMatrix::transformInverse<btSpatialForceVector>
          (btSpatialTransformationMatrix *this,btSpatialForceVector *inVec,
          btSpatialForceVector *outVec,eOutputOperation outOp)

{
  btVector3 *v;
  int in_ECX;
  btVector3 *in_RDX;
  long in_RSI;
  btVector3 bVar1;
  btVector3 *in_stack_fffffffffffffdb8;
  btMatrix3x3 *in_stack_fffffffffffffdc0;
  btMatrix3x3 *m;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  btMatrix3x3 local_1dc;
  btVector3 local_1ac [4];
  btVector3 local_16c;
  undefined8 local_15c;
  undefined8 local_154;
  undefined8 local_14c;
  undefined8 local_144;
  btVector3 local_10c [4];
  btVector3 local_cc;
  undefined8 local_bc;
  undefined8 local_b4;
  undefined8 local_ac;
  undefined8 local_a4;
  undefined8 local_2c;
  undefined8 uStack_24;
  btVector3 *local_18;
  long local_10;
  
  local_18 = in_RDX;
  if (in_ECX == 0) {
    btMatrix3x3::transpose
              ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    bVar1 = ::operator*(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    uStack_24 = bVar1.m_floats._8_8_;
    local_2c = bVar1.m_floats._0_8_;
    *(undefined8 *)local_18->m_floats = local_2c;
    *(undefined8 *)(local_18->m_floats + 2) = uStack_24;
    btMatrix3x3::transpose
              ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    bVar1 = btVector3::cross(in_stack_fffffffffffffdc0->m_el,in_stack_fffffffffffffdb8);
    local_b4 = bVar1.m_floats._8_8_;
    local_bc = bVar1.m_floats._0_8_;
    bVar1 = operator+(in_stack_fffffffffffffdc0->m_el,in_stack_fffffffffffffdb8);
    local_a4 = bVar1.m_floats._8_8_;
    local_ac = bVar1.m_floats._0_8_;
    bVar1 = ::operator*(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    *(long *)local_18[1].m_floats = bVar1.m_floats._0_8_;
    *(long *)(local_18[1].m_floats + 2) = bVar1.m_floats._8_8_;
  }
  else if (in_ECX == 1) {
    btMatrix3x3::transpose
              ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    bVar1 = ::operator*(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_cc.m_floats._8_8_ = bVar1.m_floats._8_8_;
    local_cc.m_floats._0_8_ = bVar1.m_floats._0_8_;
    btVector3::operator+=(local_18,&local_cc);
    btMatrix3x3::transpose
              ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    bVar1 = btVector3::cross(in_stack_fffffffffffffdc0->m_el,in_stack_fffffffffffffdb8);
    local_154 = bVar1.m_floats._8_8_;
    local_15c = bVar1.m_floats._0_8_;
    bVar1 = operator+(in_stack_fffffffffffffdc0->m_el,in_stack_fffffffffffffdb8);
    local_144 = bVar1.m_floats._8_8_;
    local_14c = bVar1.m_floats._0_8_;
    bVar1 = ::operator*(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_10c[0].m_floats._8_8_ = bVar1.m_floats._8_8_;
    local_10c[0].m_floats._0_8_ = bVar1.m_floats._0_8_;
    btVector3::operator+=(local_18 + 1,local_10c);
  }
  else if (in_ECX == 2) {
    local_10 = in_RSI;
    btMatrix3x3::transpose
              ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    bVar1 = ::operator*(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_16c.m_floats._8_8_ = bVar1.m_floats._8_8_;
    local_16c.m_floats._0_8_ = bVar1.m_floats._0_8_;
    btVector3::operator-=(local_18,&local_16c);
    m = &local_1dc;
    btMatrix3x3::transpose
              ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    v = (btVector3 *)(local_10 + 0x10);
    btVector3::cross(m->m_el,v);
    operator+(m->m_el,v);
    bVar1 = ::operator*(m,v);
    local_1ac[0].m_floats._8_8_ = bVar1.m_floats._8_8_;
    local_1ac[0].m_floats._0_8_ = bVar1.m_floats._0_8_;
    btVector3::operator-=(local_18 + 1,local_1ac);
  }
  return;
}

Assistant:

void transformInverse(	const SpatialVectorType &inVec,
							SpatialVectorType &outVec,
							eOutputOperation outOp = None)
	{
		if(outOp == None)
		{
			outVec.m_topVec = m_rotMat.transpose() * inVec.m_topVec;
			outVec.m_bottomVec = m_rotMat.transpose() * (inVec.m_bottomVec + m_trnVec.cross(inVec.m_topVec));
		}
		else if(outOp == Add)
		{
			outVec.m_topVec += m_rotMat.transpose() * inVec.m_topVec;
			outVec.m_bottomVec += m_rotMat.transpose() * (inVec.m_bottomVec + m_trnVec.cross(inVec.m_topVec));
		}
		else if(outOp == Subtract)
		{
			outVec.m_topVec -= m_rotMat.transpose() * inVec.m_topVec;
			outVec.m_bottomVec -= m_rotMat.transpose() * (inVec.m_bottomVec + m_trnVec.cross(inVec.m_topVec));
		}			
	}